

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font.cxx
# Opt level: O2

void fl_text_extents(char *c,int *dx,int *dy,int *w,int *h)

{
  size_t sVar1;
  
  if (c == (char *)0x0) {
    *w = 0;
    *h = 0;
    *dx = 0;
    *dy = 0;
  }
  else {
    sVar1 = strlen(c);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x39])
              (fl_graphics_driver,c,sVar1 & 0xffffffff,dx,dy,w,h);
  }
  return;
}

Assistant:

void fl_text_extents(const char *c, int &dx, int &dy, int &w, int &h) {
  if (c)  fl_text_extents(c, (int) strlen(c), dx, dy, w, h);
  else {
    w = 0; h = 0;
    dx = 0; dy = 0;
  }
}